

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O1

void play_ambient_sound(void)

{
  short sVar1;
  ushort uVar2;
  long lVar3;
  wchar_t t;
  
  sVar1 = player->depth;
  if (sVar1 == 0) {
    uVar2 = z_info->day_length;
    lVar3 = (long)turn % (long)((ulong)((uint)uVar2 + (uint)uVar2) * 5);
    sound(SBORROW8(lVar3,(ulong)uVar2 * 5) != (long)(lVar3 + (ulong)uVar2 * -5) < 0 ^ 0x87);
    return;
  }
  t = L'\x88';
  if (((0x14 < sVar1) && (t = L'\x89', 0x28 < sVar1)) && (t = L'\x8a', 0x3c < sVar1)) {
    sound((0x50 < sVar1) + 0x8b);
    return;
  }
  if ((player->opts).opt[2] == true) {
    event_signal_message(EVENT_SOUND,t,(char *)0x0);
    return;
  }
  return;
}

Assistant:

void play_ambient_sound(void)
{
	if (player->depth == 0) {
		if (is_daytime())
			sound(MSG_AMBIENT_DAY);
		else 
			sound(MSG_AMBIENT_NITE);
	} else if (player->depth <= 20) {
		sound(MSG_AMBIENT_DNG1);
	} else if (player->depth <= 40) {
		sound(MSG_AMBIENT_DNG2);
	} else if (player->depth <= 60) {
		sound(MSG_AMBIENT_DNG3);
	} else if (player->depth <= 80) {
		sound(MSG_AMBIENT_DNG4);
	} else {
		sound(MSG_AMBIENT_DNG5);
	}
}